

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdGetDefaultBlindingKey
              (void *handle,char *master_blinding_key,char *locking_script,char **blinding_key)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_e2;
  allocator local_e1;
  Script local_e0;
  Privkey privkey;
  string local_88;
  string local_68;
  Privkey local_48;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(master_blinding_key);
  if (bVar1) {
    local_e0._vptr_Script = (_func_int **)0x4fbb12;
    local_e0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x448;
    local_e0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdGetDefaultBlindingKey";
    cfd::core::logger::warn<>
              ((CfdSourceLocation *)&local_e0,"master blinding key is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_e0,"Failed to parameter. master blinding key is null or empty.",
               (allocator *)&privkey);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_e0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(locking_script);
  if (!bVar1) {
    if (blinding_key != (char **)0x0) {
      std::__cxx11::string::string((string *)&local_68,master_blinding_key,&local_e1);
      cfd::core::Privkey::Privkey(&local_48,&local_68,kMainnet,true);
      std::__cxx11::string::string((string *)&local_88,locking_script,&local_e2);
      cfd::core::Script::Script(&local_e0,&local_88);
      cfd::core::ElementsConfidentialAddress::GetBlindingKey(&privkey,&local_48,&local_e0);
      cfd::core::Script::~Script(&local_e0);
      std::__cxx11::string::~string((string *)&local_88);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      cfd::core::Privkey::GetHex_abi_cxx11_((string *)&local_e0,&privkey);
      pcVar2 = cfd::capi::CreateString((string *)&local_e0);
      *blinding_key = pcVar2;
      std::__cxx11::string::~string((string *)&local_e0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey);
      return 0;
    }
    local_e0._vptr_Script = (_func_int **)0x4fbb12;
    local_e0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x454;
    local_e0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdGetDefaultBlindingKey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_e0,"blinding key is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_e0,"Failed to parameter. blinding key is null.",
               (allocator *)&privkey);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_e0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_e0._vptr_Script = (_func_int **)0x4fbb12;
  local_e0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x44e;
  local_e0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CfdGetDefaultBlindingKey";
  cfd::core::logger::warn<>((CfdSourceLocation *)&local_e0,"locking script is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_e0,"Failed to parameter. locking script is null or empty.",
             (allocator *)&privkey);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_e0);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetDefaultBlindingKey(
    void* handle, const char* master_blinding_key, const char* locking_script,
    char** blinding_key) {
  try {
    cfd::Initialize();
    if (IsEmptyString(master_blinding_key)) {
      warn(CFD_LOG_SOURCE, "master blinding key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. master blinding key is null or empty.");
    }
    if (IsEmptyString(locking_script)) {
      warn(CFD_LOG_SOURCE, "locking script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. locking script is null or empty.");
    }
    if (blinding_key == nullptr) {
      warn(CFD_LOG_SOURCE, "blinding key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding key is null.");
    }

    Privkey privkey = ElementsConfidentialAddress::GetBlindingKey(
        Privkey(std::string(master_blinding_key)),
        Script(std::string(locking_script)));
    *blinding_key = CreateString(privkey.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}